

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_sublist(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  ushort uVar1;
  long lVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  vm_obj_id_t vVar9;
  uint uVar10;
  uint uVar11;
  size_t element_count;
  bool bVar12;
  
  if (in_argc == (uint *)0x0) {
    bVar12 = false;
  }
  else {
    bVar12 = 1 < *in_argc;
  }
  if ((getp_sublist(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar6 = __cxa_guard_acquire(&getp_sublist(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar6 != 0)) {
    getp_sublist::desc.min_argc_ = 1;
    getp_sublist::desc.opt_argc_ = 1;
    getp_sublist::desc.varargs_ = 0;
    __cxa_guard_release(&getp_sublist(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_sublist::desc);
  if (iVar6 == 0) {
    uVar1 = *(ushort *)lst;
    uVar10 = (uint)uVar1;
    iVar7 = CVmBif::pop_long_val();
    iVar6 = (iVar7 >> 0x1f & uVar1 + 1) + iVar7;
    uVar8 = uVar10;
    if (bVar12) {
      uVar8 = CVmBif::pop_long_val();
    }
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&self_val->field_0x4;
    aVar3 = self_val->val;
    lVar2 = (ulong)(iVar6 - 1U) * 5;
    uVar11 = uVar10 - (iVar6 - 1U);
    if ((int)uVar10 < iVar6 || iVar6 < 1) {
      uVar11 = 0;
      lVar2 = 0;
    }
    uVar10 = uVar11;
    if ((int)uVar8 < (int)uVar11) {
      uVar10 = uVar8;
    }
    sp_ = sp_ + 1;
    pvVar5->typ = self_val->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    if ((int)uVar8 < 0) {
      uVar10 = uVar8 + uVar11;
    }
    element_count = (size_t)uVar10;
    if ((int)uVar10 < 1) {
      element_count = 0;
    }
    vVar9 = create(0,element_count);
    memcpy((void *)(*(long *)((long)&G_obj_table_X.pages_[vVar9 >> 0xc][vVar9 & 0xfff].ptr_ + 8) + 2
                   ),lst + lVar2 + 2,element_count * 5);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_sublist(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                             const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the original element count */
    int32_t old_cnt = vmb_get_len(lst);

    /* pop the starting index; negative counts from the end of the list */
    int32_t start = CVmBif::pop_long_val(vmg0_);
    if (start < 0)
        start += old_cnt + 1;
    
    /* 
     *   pop the length, if present; if not, use the current element
     *   count, which will ensure that we use all available elements of
     *   the sublist 
     */
    int32_t len = (argc >= 2 ? CVmBif::pop_long_val(vmg0_) : old_cnt);

    /* push the 'self' as protection from GC */
    G_stk->push(self_val);

    /* skip to the first element */
    lst += VMB_LEN;

    /* skip to the desired first element */
    int32_t new_cnt;
    if (start >= 1 && start <= old_cnt)
    {
        /* it's in range - skip to the desired first element */
        lst += (start - 1) * VMB_DATAHOLDER;
        new_cnt = old_cnt - (start - 1);
    }
    else
    {
        /* there's nothing left */
        new_cnt = 0;
    }

    /* 
     *   limit the result to the desired new count, if it's shorter than
     *   what we have left (we obviously can't give them more elements
     *   than we have remaining) 
     */
    if (len < 0)
        new_cnt += len;
    else if (len < new_cnt)
        new_cnt = len;

    /* make sure the new length is non-negative */
    if (new_cnt < 0)
        new_cnt = 0;

    /* create the new list */
    vm_obj_id_t obj = create(vmg_ FALSE, new_cnt);

    /* copy the elements */
    ((CVmObjList *)vm_objp(vmg_ obj))->cons_copy_data(0, lst, new_cnt);

    /* return the new object */
    retval->set_obj(obj);

    /* discard GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}